

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend
          (SnappyScatteredWriter<snappy::SnappySinkAllocator> *this,char *ip,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  ulong __n;
  
  __n = (long)this->op_limit_ - (long)this->op_ptr_;
  while( true ) {
    uVar2 = len - __n;
    if (len < __n || uVar2 == 0) break;
    memcpy(this->op_ptr_,ip,__n);
    pcVar1 = this->op_ptr_ + __n;
    this->op_ptr_ = pcVar1;
    if (this->op_limit_ != pcVar1) {
      __assert_fail("op_limit_ - op_ptr_ == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/snappy/snappy.cc"
                    ,0x5df,
                    "bool snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend(const char *, size_t) [Allocator = snappy::SnappySinkAllocator]"
                   );
    }
    pcVar1 = pcVar1 + (this->full_size_ - (long)this->op_base_);
    this->full_size_ = (size_t)pcVar1;
    if ((char *)this->expected_ < pcVar1 + uVar2) goto LAB_00159e5d;
    ip = ip + __n;
    __n = (long)this->expected_ - (long)pcVar1;
    if (0xffff < __n) {
      __n = 0x10000;
    }
    pcVar1 = SnappySinkAllocator::Allocate(&this->allocator_,(int)__n);
    this->op_base_ = pcVar1;
    this->op_ptr_ = pcVar1;
    this->op_limit_ = pcVar1 + __n;
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->blocks_,&this->op_base_);
    len = uVar2;
  }
  memcpy(this->op_ptr_,ip,len);
  this->op_ptr_ = this->op_ptr_ + len;
LAB_00159e5d:
  return len <= __n;
}

Assistant:

bool SnappyScatteredWriter<Allocator>::SlowAppend(const char* ip, size_t len) {
  size_t avail = op_limit_ - op_ptr_;
  while (len > avail) {
    // Completely fill this block
    memcpy(op_ptr_, ip, avail);
    op_ptr_ += avail;
    assert(op_limit_ - op_ptr_ == 0);
    full_size_ += (op_ptr_ - op_base_);
    len -= avail;
    ip += avail;

    // Bounds check
    if (full_size_ + len > expected_) {
      return false;
    }

    // Make new block
    size_t bsize = std::min<size_t>(kBlockSize, expected_ - full_size_);
    op_base_ = allocator_.Allocate(bsize);
    op_ptr_ = op_base_;
    op_limit_ = op_base_ + bsize;
    blocks_.push_back(op_base_);
    avail = bsize;
  }

  memcpy(op_ptr_, ip, len);
  op_ptr_ += len;
  return true;
}